

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

Vec_Int_t * Acb_NtkFindNodes(Acb_Ntk_t *p,Vec_Int_t *vRoots,Vec_Int_t *vDivs)

{
  int iVar1;
  Vec_Int_t *vNodes_00;
  Vec_Int_t *vNodes;
  int iObj;
  int i;
  Vec_Int_t *vDivs_local;
  Vec_Int_t *vRoots_local;
  Acb_Ntk_t *p_local;
  
  vNodes_00 = Vec_IntAlloc(1000);
  Acb_NtkIncTravId(p);
  for (vNodes._4_4_ = 0; iVar1 = Vec_IntSize(vRoots), vNodes._4_4_ < iVar1;
      vNodes._4_4_ = vNodes._4_4_ + 1) {
    iVar1 = Vec_IntEntry(vRoots,vNodes._4_4_);
    iVar1 = Acb_NtkCo(p,iVar1);
    iVar1 = Acb_ObjFanin(p,iVar1,0);
    Acb_NtkFindNodes_rec(p,iVar1,vNodes_00);
  }
  if (vDivs != (Vec_Int_t *)0x0) {
    for (vNodes._4_4_ = 0; iVar1 = Vec_IntSize(vDivs), vNodes._4_4_ < iVar1;
        vNodes._4_4_ = vNodes._4_4_ + 1) {
      iVar1 = Vec_IntEntry(vDivs,vNodes._4_4_);
      Acb_NtkFindNodes_rec(p,iVar1,vNodes_00);
    }
  }
  return vNodes_00;
}

Assistant:

Vec_Int_t * Acb_NtkFindNodes( Acb_Ntk_t * p, Vec_Int_t * vRoots, Vec_Int_t * vDivs )
{
    int i, iObj;
    Vec_Int_t * vNodes = Vec_IntAlloc( 1000 );
    Acb_NtkIncTravId( p );
    Acb_NtkForEachCoDriverVec( vRoots, p, iObj, i )
        Acb_NtkFindNodes_rec( p, iObj, vNodes );
    if ( vDivs )
        Vec_IntForEachEntry( vDivs, iObj, i )
            Acb_NtkFindNodes_rec( p, iObj, vNodes );
    return vNodes;
}